

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O3

void __thiscall cmDepends::cmDepends(cmDepends *this,cmLocalGenerator *lg,string *targetDir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  
  this->_vptr_cmDepends = (_func_int **)&PTR__cmDepends_005bea28;
  this->LocalGenerator = lg;
  this->Verbose = false;
  this->FileTimeCache = (cmFileTimeCache *)0x0;
  (this->Language)._M_dataplus._M_p = (pointer)&(this->Language).field_2;
  (this->Language)._M_string_length = 0;
  (this->Language).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->TargetDirectory).field_2;
  (this->TargetDirectory)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (targetDir->_M_dataplus)._M_p;
  paVar2 = &targetDir->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&targetDir->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->TargetDirectory).field_2 + 8) = uVar4;
  }
  else {
    (this->TargetDirectory)._M_dataplus._M_p = pcVar3;
    (this->TargetDirectory).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->TargetDirectory)._M_string_length = targetDir->_M_string_length;
  (targetDir->_M_dataplus)._M_p = (pointer)paVar2;
  targetDir->_M_string_length = 0;
  (targetDir->field_2)._M_local_buf[0] = '\0';
  this->MaxPath = 0x4000;
  pcVar5 = (char *)operator_new__(0x4000);
  this->Dependee = pcVar5;
  pcVar5 = (char *)operator_new__(0x4000);
  this->Depender = pcVar5;
  (this->IncludePath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->IncludePath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->IncludePath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

cmDepends::cmDepends(cmLocalGenerator* lg, std::string targetDir)
  : LocalGenerator(lg)
  , TargetDirectory(std::move(targetDir))
  , Dependee(new char[MaxPath])
  , Depender(new char[MaxPath])
{
}